

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCanBeNull(Expr *p)

{
  byte bVar1;
  uint uVar2;
  
  while( true ) {
    bVar1 = p->op;
    if (1 < bVar1 - 0xa5) break;
    p = p->pLeft;
  }
  if (bVar1 == 0xa8) {
    bVar1 = p->op2;
  }
  uVar2 = 0;
  if ((((2 < bVar1 - 0x91) && (bVar1 != 0x6e)) && (uVar2 = 1, bVar1 == 0xa2)) &&
     (((p->flags & 0x100000) == 0 && ((p->y).pTab != (Table *)0x0)))) {
    uVar2 = 0;
    if (-1 < (long)p->iColumn) {
      uVar2 = (uint)(((p->y).pTab)->aCol[p->iColumn].notNull == '\0');
    }
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCanBeNull(const Expr *p){
  u8 op;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){
    p = p->pLeft;
  }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER:
    case TK_STRING:
    case TK_FLOAT:
    case TK_BLOB:
      return 0;
    case TK_COLUMN:
      return ExprHasProperty(p, EP_CanBeNull) ||
             p->y.pTab==0 ||  /* Reference to column of index on expression */
             (p->iColumn>=0 && p->y.pTab->aCol[p->iColumn].notNull==0);
    default:
      return 1;
  }
}